

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateMemberAccess(ExpressionEvalContext *ctx,ExprMemberAccess *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  VariableData *pVVar5;
  int iVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  undefined4 extraout_var_00;
  TypeRef *type;
  uchar *ptr;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pEVar7 = Evaluate(ctx,expression->value);
      if (pEVar7 != (ExprBase *)0x0) {
        if (pEVar7->typeID == 9) {
          Report(ctx,"ERROR: member access of null pointer");
          return (ExprBase *)0x0;
        }
        if (pEVar7->typeID == 0xc) {
          pVVar5 = expression->member->variable;
          ptr = (uchar *)((ulong)pVVar5->offset + (long)pEVar7[1]._vptr_ExprBase);
          if (ptr + pVVar5->type->size <= *(uchar **)&pEVar7[1].typeID) {
            pAVar2 = ctx->ctx->allocator;
            iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
            pSVar3 = (expression->super_ExprBase).source;
            type = ExpressionContext::GetReferenceType(ctx->ctx,expression->member->variable->type);
            ExprPointerLiteral::ExprPointerLiteral
                      ((ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar6),pSVar3,
                       &type->super_TypeBase,ptr,ptr + expression->member->variable->type->size);
            pEVar7 = CheckType(&expression->super_ExprBase,
                               (ExprBase *)CONCAT44(extraout_var_00,iVar6));
            return pEVar7;
          }
          __assert_fail("ptr->ptr + expression->member->variable->offset + expression->member->variable->type->size <= ptr->end"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x62b,
                        "ExprBase *EvaluateMemberAccess(ExpressionEvalContext &, ExprMemberAccess *)"
                       );
        }
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x62a,
                      "ExprBase *EvaluateMemberAccess(ExpressionEvalContext &, ExprMemberAccess *)")
        ;
      }
    }
    else {
      Report(ctx,"ERROR: instruction limit reached");
    }
    pEVar7 = (ExprBase *)0x0;
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar3;
    pEVar7->type = pTVar4;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6b40;
  }
  return pEVar7;
}

Assistant:

ExprBase* EvaluateMemberAccess(ExpressionEvalContext &ctx, ExprMemberAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(isType<ExprNullptrLiteral>(value))
		return Report(ctx, "ERROR: member access of null pointer");

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

	assert(ptr);
	assert(ptr->ptr + expression->member->variable->offset + expression->member->variable->type->size <= ptr->end);

	unsigned char *targetPtr = ptr->ptr + expression->member->variable->offset;

	ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(expression->member->variable->type), targetPtr, targetPtr + expression->member->variable->type->size);

	return CheckType(expression, shifted);
}